

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O2

bool __thiscall
cmDependsFortran::WriteDependenciesReal
          (cmDependsFortran *this,char *obj,cmFortranSourceInfo *info,string *mod_dir,
          char *stamp_dir,ostream *makeDepends,ostream *internalDepends)

{
  _Rb_tree_node_base *__k;
  cmLocalGenerator *pcVar1;
  cmMakefile *this_00;
  bool bVar2;
  char *pcVar3;
  ostream *poVar4;
  _Base_ptr p_Var5;
  const_iterator cVar6;
  iterator iVar7;
  iterator iVar8;
  char *pcVar9;
  char *path;
  char *path_00;
  char *path_01;
  char *path_02;
  char *path_03;
  char *path_04;
  char *path_05;
  cmDependsFortranInternals *pcVar10;
  string proxy;
  string stampFile_1;
  string obj_m;
  string binDir;
  string modFile;
  string obj_i;
  string local_148;
  string local_128;
  char *local_108;
  _Base_ptr local_100;
  string local_f8;
  string local_d8;
  string local_b8;
  string *local_98;
  string local_90;
  string local_70;
  string local_50;
  
  pcVar9 = (info->Source)._M_dataplus._M_p;
  local_108 = stamp_dir;
  local_98 = mod_dir;
  pcVar3 = cmLocalGenerator::GetBinaryDirectory((this->super_cmDepends).LocalGenerator);
  std::__cxx11::string::string((string *)&local_d8,pcVar3,(allocator *)&local_90);
  std::__cxx11::string::string((string *)&local_f8,obj,(allocator *)&local_148);
  MaybeConvertToRelativePath(&local_90,this,&local_d8,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  cmSystemTools::ConvertToOutputPath_abi_cxx11_
            (&local_f8,(cmSystemTools *)local_90._M_dataplus._M_p,path);
  poVar4 = std::operator<<(internalDepends,(string *)&local_90);
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<(internalDepends," ");
  poVar4 = std::operator<<(poVar4,pcVar9);
  std::endl<char,std::char_traits<char>>(poVar4);
  for (p_Var5 = (info->Includes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &(info->Includes)._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
    poVar4 = std::operator<<(makeDepends,(string *)&local_f8);
    poVar4 = std::operator<<(poVar4,": ");
    MaybeConvertToRelativePath(&local_b8,this,&local_d8,(string *)(p_Var5 + 1));
    cmSystemTools::ConvertToOutputPath_abi_cxx11_
              (&local_148,(cmSystemTools *)local_b8._M_dataplus._M_p,path_00);
    poVar4 = std::operator<<(poVar4,(string *)&local_148);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_b8);
    poVar4 = std::operator<<(internalDepends," ");
    poVar4 = std::operator<<(poVar4,(string *)(p_Var5 + 1));
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  std::endl<char,std::char_traits<char>>(makeDepends);
  p_Var5 = (info->Requires)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_100 = &(info->Provides)._M_t._M_impl.super__Rb_tree_header._M_header;
  do {
    if ((_Rb_tree_header *)p_Var5 == &(info->Requires)._M_t._M_impl.super__Rb_tree_header) {
      for (p_Var5 = (info->Provides)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var5 != local_100; p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
        std::__cxx11::string::string((string *)&local_148,local_108,(allocator *)&local_b8);
        std::__cxx11::string::append((char *)&local_148);
        std::__cxx11::string::append((string *)&local_148);
        std::__cxx11::string::append((char *)&local_148);
        MaybeConvertToRelativePath(&local_128,this,&local_d8,&local_148);
        cmSystemTools::ConvertToOutputPath_abi_cxx11_
                  (&local_b8,(cmSystemTools *)local_128._M_dataplus._M_p,path_04);
        std::__cxx11::string::operator=((string *)&local_148,(string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_128);
        poVar4 = std::operator<<(makeDepends,(string *)&local_148);
        poVar4 = std::operator<<(poVar4,": ");
        poVar4 = std::operator<<(poVar4,(string *)&local_f8);
        poVar4 = std::operator<<(poVar4,".provides");
        std::endl<char,std::char_traits<char>>(poVar4);
        std::__cxx11::string::~string((string *)&local_148);
      }
      if ((info->Provides)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        poVar4 = std::operator<<(makeDepends,(string *)&local_f8);
        std::operator<<(poVar4,".provides.build:\n");
        for (p_Var5 = (info->Provides)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            p_Var5 != local_100; p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)this->Internal,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var5 + 1));
          cmsys::SystemTools::LowerCase(&local_148,(string *)(p_Var5 + 1));
          std::__cxx11::string::string((string *)&local_b8,(string *)local_98);
          std::__cxx11::string::append((char *)&local_b8);
          std::__cxx11::string::append((string *)&local_b8);
          pcVar1 = (this->super_cmDepends).LocalGenerator;
          MaybeConvertToRelativePath(&local_50,this,&local_d8,&local_b8);
          cmOutputConverter::ConvertToOutputFormat
                    (&local_128,&pcVar1->super_cmOutputConverter,&local_50,SHELL);
          std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_128);
          std::__cxx11::string::~string((string *)&local_128);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::string((string *)&local_128,local_108,(allocator *)&local_50);
          std::__cxx11::string::append((char *)&local_128);
          std::__cxx11::string::append((string *)&local_128);
          std::__cxx11::string::append((char *)&local_128);
          pcVar1 = (this->super_cmDepends).LocalGenerator;
          MaybeConvertToRelativePath(&local_70,this,&local_d8,&local_128);
          cmOutputConverter::ConvertToOutputFormat
                    (&local_50,&pcVar1->super_cmOutputConverter,&local_70,SHELL);
          std::__cxx11::string::operator=((string *)&local_128,(string *)&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_70);
          poVar4 = std::operator<<(makeDepends,"\t$(CMAKE_COMMAND) -E cmake_copy_f90_mod ");
          poVar4 = std::operator<<(poVar4,(string *)&local_b8);
          poVar4 = std::operator<<(poVar4," ");
          std::operator<<(poVar4,(string *)&local_128);
          this_00 = ((this->super_cmDepends).LocalGenerator)->Makefile;
          std::__cxx11::string::string
                    ((string *)&local_50,"CMAKE_Fortran_COMPILER_ID",(allocator *)&local_70);
          pcVar9 = cmMakefile::GetDefinition(this_00,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          if ((pcVar9 != (char *)0x0) && (*pcVar9 != '\0')) {
            poVar4 = std::operator<<(makeDepends," ");
            std::operator<<(poVar4,pcVar9);
          }
          std::operator<<(makeDepends,"\n");
          std::__cxx11::string::~string((string *)&local_128);
          std::__cxx11::string::~string((string *)&local_b8);
          std::__cxx11::string::~string((string *)&local_148);
        }
        poVar4 = std::operator<<(makeDepends,"\t$(CMAKE_COMMAND) -E touch ");
        poVar4 = std::operator<<(poVar4,(string *)&local_f8);
        std::operator<<(poVar4,".provides.build\n");
        std::__cxx11::string::string
                  ((string *)&local_148,(string *)&(this->super_cmDepends).TargetDirectory);
        std::__cxx11::string::append((char *)&local_148);
        MaybeConvertToRelativePath(&local_128,this,&local_d8,&local_148);
        cmSystemTools::ConvertToOutputPath_abi_cxx11_
                  (&local_b8,(cmSystemTools *)local_128._M_dataplus._M_p,path_05);
        std::__cxx11::string::operator=((string *)&local_148,(string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_128);
        poVar4 = std::operator<<(makeDepends,(string *)&local_148);
        poVar4 = std::operator<<(poVar4,": ");
        poVar4 = std::operator<<(poVar4,(string *)&local_f8);
        std::operator<<(poVar4,".provides.build\n");
        std::__cxx11::string::~string((string *)&local_148);
      }
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_d8);
      return true;
    }
    __k = p_Var5 + 1;
    cVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&(info->Provides)._M_t,(key_type *)__k);
    if (cVar6._M_node == local_100) {
      iVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)this->Internal,(key_type *)__k);
      pcVar10 = this->Internal;
      if ((_Rb_tree_header *)iVar7._M_node !=
          &(pcVar10->TargetProvides)._M_t._M_impl.super__Rb_tree_header) {
        std::__cxx11::string::string((string *)&local_148,local_108,(allocator *)&local_b8);
        std::__cxx11::string::append((char *)&local_148);
        std::__cxx11::string::append((string *)&local_148);
        std::__cxx11::string::append((char *)&local_148);
        MaybeConvertToRelativePath(&local_128,this,&local_d8,&local_148);
        cmSystemTools::ConvertToOutputPath_abi_cxx11_
                  (&local_b8,(cmSystemTools *)local_128._M_dataplus._M_p,path_01);
        std::__cxx11::string::operator=((string *)&local_148,(string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_128);
        poVar4 = std::operator<<(makeDepends,(string *)&local_f8);
        poVar4 = std::operator<<(poVar4,".requires: ");
        poVar4 = std::operator<<(poVar4,(string *)&local_148);
        std::endl<char,std::char_traits<char>>(poVar4);
        std::__cxx11::string::~string((string *)&local_148);
        pcVar10 = this->Internal;
      }
      iVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&(pcVar10->TargetRequires)._M_t,(key_type *)__k);
      if ((_Rb_tree_header *)iVar8._M_node ==
          &(this->Internal->TargetRequires)._M_t._M_impl.super__Rb_tree_header) {
        abort();
      }
      if (iVar8._M_node[2]._M_parent == (_Base_ptr)0x0) {
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        local_148._M_string_length = 0;
        local_148.field_2._M_local_buf[0] = '\0';
        bVar2 = FindModule(this,(string *)__k,&local_148);
        if (bVar2) {
          MaybeConvertToRelativePath(&local_128,this,&local_d8,&local_148);
          cmSystemTools::ConvertToOutputPath_abi_cxx11_
                    (&local_b8,(cmSystemTools *)local_128._M_dataplus._M_p,path_03);
          std::__cxx11::string::operator=((string *)&local_148,(string *)&local_b8);
          std::__cxx11::string::~string((string *)&local_b8);
          std::__cxx11::string::~string((string *)&local_128);
          poVar4 = std::operator<<(makeDepends,(string *)&local_f8);
          poVar4 = std::operator<<(poVar4,": ");
          poVar4 = std::operator<<(poVar4,(string *)&local_148);
          std::operator<<(poVar4,"\n");
        }
      }
      else {
        MaybeConvertToRelativePath(&local_b8,this,&local_d8,(string *)(iVar8._M_node + 2));
        cmSystemTools::ConvertToOutputPath_abi_cxx11_
                  (&local_148,(cmSystemTools *)local_b8._M_dataplus._M_p,path_02);
        std::__cxx11::string::~string((string *)&local_b8);
        poVar4 = std::operator<<(makeDepends,(string *)&local_f8);
        poVar4 = std::operator<<(poVar4,": ");
        poVar4 = std::operator<<(poVar4,(string *)&local_148);
        std::operator<<(poVar4,"\n");
      }
      std::__cxx11::string::~string((string *)&local_148);
    }
    p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
  } while( true );
}

Assistant:

bool cmDependsFortran::WriteDependenciesReal(const char* obj,
                                             cmFortranSourceInfo const& info,
                                             std::string const& mod_dir,
                                             const char* stamp_dir,
                                             std::ostream& makeDepends,
                                             std::ostream& internalDepends)
{
  typedef cmDependsFortranInternals::TargetRequiresMap TargetRequiresMap;

  // Get the source file for this object.
  const char* src = info.Source.c_str();

  // Write the include dependencies to the output stream.
  std::string binDir = this->LocalGenerator->GetBinaryDirectory();
  std::string obj_i = this->MaybeConvertToRelativePath(binDir, obj);
  std::string obj_m = cmSystemTools::ConvertToOutputPath(obj_i.c_str());
  internalDepends << obj_i << std::endl;
  internalDepends << " " << src << std::endl;
  for (std::set<std::string>::const_iterator i = info.Includes.begin();
       i != info.Includes.end(); ++i) {
    makeDepends << obj_m << ": "
                << cmSystemTools::ConvertToOutputPath(
                     this->MaybeConvertToRelativePath(binDir, *i).c_str())
                << std::endl;
    internalDepends << " " << *i << std::endl;
  }
  makeDepends << std::endl;

  // Write module requirements to the output stream.
  for (std::set<std::string>::const_iterator i = info.Requires.begin();
       i != info.Requires.end(); ++i) {
    // Require only modules not provided in the same source.
    if (std::set<std::string>::const_iterator(info.Provides.find(*i)) !=
        info.Provides.end()) {
      continue;
    }

    // If the module is provided in this target special handling is
    // needed.
    if (this->Internal->TargetProvides.find(*i) !=
        this->Internal->TargetProvides.end()) {
      // The module is provided by a different source in the same
      // target.  Add the proxy dependency to make sure the other
      // source builds first.
      std::string proxy = stamp_dir;
      proxy += "/";
      proxy += *i;
      proxy += ".mod.proxy";
      proxy = cmSystemTools::ConvertToOutputPath(
        this->MaybeConvertToRelativePath(binDir, proxy).c_str());

      // since we require some things add them to our list of requirements
      makeDepends << obj_m << ".requires: " << proxy << std::endl;
    }

    // The object file should depend on timestamped files for the
    // modules it uses.
    TargetRequiresMap::const_iterator required =
      this->Internal->TargetRequires.find(*i);
    if (required == this->Internal->TargetRequires.end()) {
      abort();
    }
    if (!required->second.empty()) {
      // This module is known.  Depend on its timestamp file.
      std::string stampFile = cmSystemTools::ConvertToOutputPath(
        this->MaybeConvertToRelativePath(binDir, required->second).c_str());
      makeDepends << obj_m << ": " << stampFile << "\n";
    } else {
      // This module is not known to CMake.  Try to locate it where
      // the compiler will and depend on that.
      std::string module;
      if (this->FindModule(*i, module)) {
        module = cmSystemTools::ConvertToOutputPath(
          this->MaybeConvertToRelativePath(binDir, module).c_str());
        makeDepends << obj_m << ": " << module << "\n";
      }
    }
  }

  // Write provided modules to the output stream.
  for (std::set<std::string>::const_iterator i = info.Provides.begin();
       i != info.Provides.end(); ++i) {
    std::string proxy = stamp_dir;
    proxy += "/";
    proxy += *i;
    proxy += ".mod.proxy";
    proxy = cmSystemTools::ConvertToOutputPath(
      this->MaybeConvertToRelativePath(binDir, proxy).c_str());
    makeDepends << proxy << ": " << obj_m << ".provides" << std::endl;
  }

  // If any modules are provided then they must be converted to stamp files.
  if (!info.Provides.empty()) {
    // Create a target to copy the module after the object file
    // changes.
    makeDepends << obj_m << ".provides.build:\n";
    for (std::set<std::string>::const_iterator i = info.Provides.begin();
         i != info.Provides.end(); ++i) {
      // Include this module in the set provided by this target.
      this->Internal->TargetProvides.insert(*i);

      // Always use lower case for the mod stamp file name.  The
      // cmake_copy_f90_mod will call back to this class, which will
      // try various cases for the real mod file name.
      std::string m = cmSystemTools::LowerCase(*i);
      std::string modFile = mod_dir;
      modFile += "/";
      modFile += *i;
      modFile = this->LocalGenerator->ConvertToOutputFormat(
        this->MaybeConvertToRelativePath(binDir, modFile),
        cmOutputConverter::SHELL);
      std::string stampFile = stamp_dir;
      stampFile += "/";
      stampFile += m;
      stampFile += ".mod.stamp";
      stampFile = this->LocalGenerator->ConvertToOutputFormat(
        this->MaybeConvertToRelativePath(binDir, stampFile),
        cmOutputConverter::SHELL);
      makeDepends << "\t$(CMAKE_COMMAND) -E cmake_copy_f90_mod " << modFile
                  << " " << stampFile;
      cmMakefile* mf = this->LocalGenerator->GetMakefile();
      const char* cid = mf->GetDefinition("CMAKE_Fortran_COMPILER_ID");
      if (cid && *cid) {
        makeDepends << " " << cid;
      }
      makeDepends << "\n";
    }
    // After copying the modules update the timestamp file so that
    // copying will not be done again until the source rebuilds.
    makeDepends << "\t$(CMAKE_COMMAND) -E touch " << obj_m
                << ".provides.build\n";

    // Make sure the module timestamp rule is evaluated by the time
    // the target finishes building.
    std::string driver = this->TargetDirectory;
    driver += "/build";
    driver = cmSystemTools::ConvertToOutputPath(
      this->MaybeConvertToRelativePath(binDir, driver).c_str());
    makeDepends << driver << ": " << obj_m << ".provides.build\n";
  }

  return true;
}